

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::getVariance
          (Vector<double,_3U> *__return_storage_ptr__,Accumulator<OpenMD::Vector<double,_3U>_> *this
          )

{
  size_t i;
  long lVar1;
  double dVar2;
  double dVar3;
  
  Vector<double,_3U>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar2 = (this->Avg_).data_[lVar1];
    dVar3 = (this->Avg2_).data_[lVar1] - dVar2 * dVar2;
    dVar2 = 0.0;
    if (0.0 <= dVar3) {
      dVar2 = dVar3;
    }
    __return_storage_ptr__->data_[lVar1] = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<RealType, Dim> getVariance() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> var {};

      for (std::size_t i = 0; i < Dim; i++) {
        var[i] = (Avg2_[i] - Avg_[i] * Avg_[i]);
        if (var[i] < 0) var[i] = 0;
      }

      return var;
    }